

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

void type(void)

{
  ostream *poVar1;
  allocator<char> local_39;
  string str;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\n");
  poVar1 = std::operator<<(poVar1,"======================================================");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"     TYPE                                           ");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"======================================================");
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"Is this string an std::string? ",&local_39);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&str);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Is a string streamable? ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Check if int is in the list (int, double, float): ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void type()
 {
  std::cout << "\n" << "======================================================" << "\n"
                      << "     TYPE                                           " << "\n"
                      << "======================================================" << "\n"

                      << "\n";

  // is_str
  std::string str = "Is this string an std::string? ";
  std::cout << str << agr::is_str( str ) << "\n";

  // is_streamable
  std::cout << "Is a string streamable? " << agr::is_streamable <std::ostream, std::string>::value << "\n";

  // is_any
  std::cout << "Check if int is in the list (int, double, float): " << agr::is_any<int, double, float>() << "\n";
 }